

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::ssl_client_handshake(SSL_HANDSHAKE *hs)

{
  int iVar1;
  ssl_hs_wait_t local_1c;
  ssl_client_hs_state_t state;
  ssl_hs_wait_t ret;
  SSL_HANDSHAKE *hs_local;
  
  do {
    if (hs->state == 0x15) {
      ssl_do_info_callback(hs->ssl,0x20,1);
      return ssl_hs_ok;
    }
    local_1c = ssl_hs_error;
    iVar1 = hs->state;
    switch(iVar1) {
    case 0:
      local_1c = do_start_connect(hs);
      break;
    case 1:
      local_1c = do_enter_early_data(hs);
      break;
    case 2:
      local_1c = do_early_reverify_server_certificate(hs);
      break;
    case 3:
      local_1c = do_read_server_hello(hs);
      break;
    case 4:
      local_1c = do_tls13(hs);
      break;
    case 5:
      local_1c = do_read_server_certificate(hs);
      break;
    case 6:
      local_1c = do_read_certificate_status(hs);
      break;
    case 7:
      local_1c = do_verify_server_certificate(hs);
      break;
    case 8:
      local_1c = do_reverify_server_certificate(hs);
      break;
    case 9:
      local_1c = do_read_server_key_exchange(hs);
      break;
    case 10:
      local_1c = do_read_certificate_request(hs);
      break;
    case 0xb:
      local_1c = do_read_server_hello_done(hs);
      break;
    case 0xc:
      local_1c = do_send_client_certificate(hs);
      break;
    case 0xd:
      local_1c = do_send_client_key_exchange(hs);
      break;
    case 0xe:
      local_1c = do_send_client_certificate_verify(hs);
      break;
    case 0xf:
      local_1c = do_send_client_finished(hs);
      break;
    case 0x10:
      local_1c = do_finish_flight(hs);
      break;
    case 0x11:
      local_1c = do_read_session_ticket(hs);
      break;
    case 0x12:
      local_1c = do_process_change_cipher_spec(hs);
      break;
    case 0x13:
      local_1c = do_read_server_finished(hs);
      break;
    case 0x14:
      local_1c = do_finish_client_handshake(hs);
    }
    if (hs->state != iVar1) {
      ssl_do_info_callback(hs->ssl,0x1001,1);
    }
  } while (local_1c == ssl_hs_ok);
  return local_1c;
}

Assistant:

enum ssl_hs_wait_t ssl_client_handshake(SSL_HANDSHAKE *hs) {
  while (hs->state != state_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum ssl_client_hs_state_t state =
        static_cast<enum ssl_client_hs_state_t>(hs->state);
    switch (state) {
      case state_start_connect:
        ret = do_start_connect(hs);
        break;
      case state_enter_early_data:
        ret = do_enter_early_data(hs);
        break;
      case state_early_reverify_server_certificate:
        ret = do_early_reverify_server_certificate(hs);
        break;
      case state_read_server_hello:
        ret = do_read_server_hello(hs);
        break;
      case state_tls13:
        ret = do_tls13(hs);
        break;
      case state_read_server_certificate:
        ret = do_read_server_certificate(hs);
        break;
      case state_read_certificate_status:
        ret = do_read_certificate_status(hs);
        break;
      case state_verify_server_certificate:
        ret = do_verify_server_certificate(hs);
        break;
      case state_reverify_server_certificate:
        ret = do_reverify_server_certificate(hs);
        break;
      case state_read_server_key_exchange:
        ret = do_read_server_key_exchange(hs);
        break;
      case state_read_certificate_request:
        ret = do_read_certificate_request(hs);
        break;
      case state_read_server_hello_done:
        ret = do_read_server_hello_done(hs);
        break;
      case state_send_client_certificate:
        ret = do_send_client_certificate(hs);
        break;
      case state_send_client_key_exchange:
        ret = do_send_client_key_exchange(hs);
        break;
      case state_send_client_certificate_verify:
        ret = do_send_client_certificate_verify(hs);
        break;
      case state_send_client_finished:
        ret = do_send_client_finished(hs);
        break;
      case state_finish_flight:
        ret = do_finish_flight(hs);
        break;
      case state_read_session_ticket:
        ret = do_read_session_ticket(hs);
        break;
      case state_process_change_cipher_spec:
        ret = do_process_change_cipher_spec(hs);
        break;
      case state_read_server_finished:
        ret = do_read_server_finished(hs);
        break;
      case state_finish_client_handshake:
        ret = do_finish_client_handshake(hs);
        break;
      case state_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_CONNECT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  ssl_do_info_callback(hs->ssl, SSL_CB_HANDSHAKE_DONE, 1);
  return ssl_hs_ok;
}